

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCBoolean.cpp
# Opt level: O3

void Assimp::IFC::ProcessBooleanExtrudedAreaSolidDifference
               (IfcExtrudedAreaSolid *as,TempMesh *result,TempMesh *first_operand,
               ConversionData *conv)

{
  pointer puVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  pointer paVar2;
  pointer puVar3;
  uint pcount;
  TempMesh temp;
  shared_ptr<Assimp::IFC::TempMesh> meshtmp;
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> openings;
  uint local_11c;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> local_118;
  undefined1 local_f8 [24];
  pointer local_e0;
  iterator local_d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_d0;
  element_type *local_c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_c0;
  pointer local_b8;
  pointer paStack_b0;
  pointer local_a8;
  TempMesh *local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  IfcVector3 local_88;
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> local_70;
  double local_58;
  double dStack_50;
  IfcVector3 local_48;
  
  if (as == (IfcExtrudedAreaSolid *)0x0) {
    __assert_fail("as != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Importer/IFC/IFCBoolean.cpp"
                  ,0x2d3,
                  "void Assimp::IFC::ProcessBooleanExtrudedAreaSolidDifference(const Schema_2x3::IfcExtrudedAreaSolid *, TempMesh &, const TempMesh &, ConversionData &)"
                 );
  }
  local_98 = (TempMesh *)operator_new(0x30);
  (local_98->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_98->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_98->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_98->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_98->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_98->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Assimp::IFC::TempMesh*>
            (&local_90,local_98);
  ProcessExtrudedAreaSolid(as,local_98,conv,false);
  this._M_pi = local_90._M_pi;
  if (local_90._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    _Stack_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_90._M_pi)->_M_use_count = (local_90._M_pi)->_M_use_count + 1;
      UNLOCK();
      _Stack_d0._M_pi = local_90._M_pi;
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_90._M_pi)->_M_use_count = (local_90._M_pi)->_M_use_count + 1;
        UNLOCK();
        goto LAB_005bfe1d;
      }
    }
    else {
      (local_90._M_pi)->_M_use_count = (local_90._M_pi)->_M_use_count + 1;
    }
    _Stack_d0._M_pi = local_90._M_pi;
    (local_90._M_pi)->_M_use_count = (local_90._M_pi)->_M_use_count + 1;
  }
LAB_005bfe1d:
  local_d8._M_current = (uint *)local_98;
  local_e0 = (pointer)0x0;
  local_f8._16_8_ = (pointer)0x0;
  local_f8._8_8_ = (pointer)0x0;
  local_b8 = (pointer)0x0;
  paStack_b0 = (pointer)0x0;
  local_c8 = (element_type *)0x0;
  _Stack_c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_a8 = (pointer)0x0;
  local_f8._0_8_ = as;
  std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>::vector
            (&local_70,1,(value_type *)local_f8,(allocator_type *)&local_88);
  if (local_b8 != (pointer)0x0) {
    operator_delete(local_b8,(long)local_a8 - (long)local_b8);
  }
  if (_Stack_c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_c0._M_pi);
  }
  if (_Stack_d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_d0._M_pi);
  }
  if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi);
  }
  std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::operator=
            (&result->mVerts,&first_operand->mVerts);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&result->mVertcnt,&first_operand->mVertcnt);
  local_d8._M_current = (uint *)0x0;
  _Stack_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_f8._16_8_ = (pointer)0x0;
  local_e0 = (pointer)0x0;
  local_f8._0_8_ = (pointer)0x0;
  local_f8._8_8_ = (pointer)0x0;
  puVar3 = (first_operand->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (first_operand->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar3 != puVar1) {
    paVar2 = (first_operand->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_58 = 0.0;
    dStack_50 = 1.0;
    do {
      local_11c = *puVar3;
      TempMesh::Clear((TempMesh *)local_f8);
      std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<aiVector3t<double>const*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>>
                ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)local_f8,
                 local_f8._8_8_,paVar2,paVar2 + local_11c);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_current == _Stack_d0._M_pi) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_e0,local_d8,
                   &local_11c);
      }
      else {
        *local_d8._M_current = local_11c;
        local_d8._M_current = local_d8._M_current + 1;
      }
      TempMesh::ComputeLastPolygonNormal(&local_88,(TempMesh *)local_f8,false);
      if (1e-05 <= local_88.z * local_88.z + local_88.x * local_88.x + local_88.y * local_88.y) {
        local_118.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_118.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_118.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_118.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x18);
        local_118.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_118.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start + 1;
        (local_118.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
         _M_impl.super__Vector_impl_data._M_start)->x = 1.0;
        (local_118.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
         _M_impl.super__Vector_impl_data._M_start)->y = 0.0;
        (local_118.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
         _M_impl.super__Vector_impl_data._M_start)->z = 0.0;
        local_48.x = local_58;
        local_48.y = dStack_50;
        local_48.z = 0.0;
        local_118.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             local_118.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        GenerateOpenings(&local_70,&local_118,(TempMesh *)local_f8,false,true,&local_48);
        if (local_118.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_118.
                          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_118.
                                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_118.
                                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        TempMesh::Append(result,(TempMesh *)local_f8);
        paVar2 = paVar2 + local_11c;
      }
      else {
        LogFunctions<Assimp::IFCImporter>::LogWarn((char *)0x5bff9d);
      }
      puVar3 = puVar3 + 1;
    } while (puVar3 != puVar1);
  }
  LogFunctions<Assimp::IFCImporter>::LogDebug((char *)0x5c0075);
  if (local_e0 != (pointer)0x0) {
    operator_delete(local_e0,(long)_Stack_d0._M_pi - (long)local_e0);
  }
  if ((pointer)local_f8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_f8._0_8_,local_f8._16_8_ - local_f8._0_8_);
  }
  std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>::~vector
            (&local_70);
  if (local_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90._M_pi);
  }
  return;
}

Assistant:

void ProcessBooleanExtrudedAreaSolidDifference(const Schema_2x3::IfcExtrudedAreaSolid* as, TempMesh& result,
                                               const TempMesh& first_operand,
                                               ConversionData& conv)
{
    ai_assert(as != NULL);

    // This case is handled by reduction to an instance of the quadrify() algorithm.
    // Obviously, this won't work for arbitrarily complex cases. In fact, the first
    // operand should be near-planar. Luckily, this is usually the case in Ifc
    // buildings.

    std::shared_ptr<TempMesh> meshtmp = std::shared_ptr<TempMesh>(new TempMesh());
    ProcessExtrudedAreaSolid(*as,*meshtmp,conv,false);

    std::vector<TempOpening> openings(1, TempOpening(as,IfcVector3(0,0,0),meshtmp,std::shared_ptr<TempMesh>()));

    result = first_operand;

    TempMesh temp;

    std::vector<IfcVector3>::const_iterator vit = first_operand.mVerts.begin();
    for(unsigned int pcount : first_operand.mVertcnt) {
        temp.Clear();

        temp.mVerts.insert(temp.mVerts.end(), vit, vit + pcount);
        temp.mVertcnt.push_back(pcount);

        // The algorithms used to generate mesh geometry sometimes
        // spit out lines or other degenerates which must be
        // filtered to avoid running into assertions later on.

        // ComputePolygonNormal returns the Newell normal, so the
        // length of the normal is the area of the polygon.
        const IfcVector3& normal = temp.ComputeLastPolygonNormal(false);
        if (normal.SquareLength() < static_cast<IfcFloat>(1e-5)) {
            IFCImporter::LogWarn("skipping degenerate polygon (ProcessBooleanExtrudedAreaSolidDifference)");
            continue;
        }

        GenerateOpenings(openings, std::vector<IfcVector3>(1,IfcVector3(1,0,0)), temp, false, true);
        result.Append(temp);

        vit += pcount;
    }

    IFCImporter::LogDebug("generating CSG geometry by geometric difference to a solid (IfcExtrudedAreaSolid)");
}